

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.cc
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Dir::matchFiles(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *__return_storage_ptr__,Dir *this,string *pattern)

{
  size_type *psVar1;
  pointer pcVar2;
  int iVar3;
  dirent *pdVar4;
  size_t sVar5;
  undefined8 *puVar6;
  ulong uVar7;
  char *__name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong *local_50;
  long local_48;
  ulong local_40 [2];
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    do {
      pdVar4 = readdir((DIR *)this->dir_);
      if (pdVar4 == (dirent *)0x0) {
        return __return_storage_ptr__;
      }
      __name = pdVar4->d_name;
      iVar3 = fnmatch((pattern->_M_dataplus)._M_p,__name,0);
    } while (iVar3 != 0);
    pcVar2 = (this->path_)._M_dataplus._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (this->path_)._M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    local_90 = local_80;
    sVar5 = strlen(__name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__name,__name + sVar5);
    uVar7 = 0xf;
    if (local_50 != local_40) {
      uVar7 = local_40[0];
    }
    if (uVar7 < (ulong)(local_88 + local_48)) {
      uVar7 = 0xf;
      if (local_90 != local_80) {
        uVar7 = local_80[0];
      }
      if (uVar7 < (ulong)(local_88 + local_48)) goto LAB_0010dc83;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
    }
    else {
LAB_0010dc83:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
    }
    psVar1 = puVar6 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_70.field_2._M_allocated_capacity = *psVar1;
      local_70.field_2._8_8_ = puVar6[3];
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    }
    else {
      local_70.field_2._M_allocated_capacity = *psVar1;
      local_70._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_70._M_string_length = puVar6[1];
    *puVar6 = psVar1;
    puVar6[1] = 0;
    *(undefined1 *)psVar1 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
  } while( true );
}

Assistant:

std::vector<std::string> Dir::matchFiles(const std::string& pattern) {
  std::vector<std::string> result;
  struct dirent *ent;
  while ((ent = readdir(dir_)) != NULL) {
    if (fnmatch(pattern.c_str(), ent->d_name, 0) == 0) {
      result.push_back(path_ + "/" + std::string(ent->d_name));
    }
  }
  return result;
}